

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

apx_error_t apx_vm_select_program(apx_vm_t *self,apx_program_t *program)

{
  uint32_t size;
  apx_error_t aVar1;
  uint8_t *data;
  
  aVar1 = 1;
  if (program != (apx_program_t *)0x0 && self != (apx_vm_t *)0x0) {
    data = adt_bytearray_data(program);
    size = adt_bytearray_length(program);
    aVar1 = apx_vm_decoder_select_program(&self->decoder,data,size);
    if (aVar1 == 0) {
      aVar1 = apx_vm_decoder_parse_program_header(&self->decoder,&self->program_header);
      return aVar1;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_vm_select_program(apx_vm_t* self, apx_program_t const* program)
{
   if ( (self != NULL) && (program != NULL) )
   {
      uint8_t const* program_begin = adt_bytearray_data(program);
      uint32_t const program_size = adt_bytearray_length(program);
      apx_error_t result = apx_vm_decoder_select_program(&self->decoder,program_begin, program_size);
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_decoder_parse_program_header(&self->decoder, &self->program_header);
      }
      return result;

   }
   return APX_INVALID_ARGUMENT_ERROR;
}